

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.h
# Opt level: O2

uint re2c::Skeleton::rule2key<unsigned_int>(rule_rank_t r)

{
  bool bVar1;
  uint32_t uVar2;
  rule_rank_t r_local;
  
  bVar1 = rule_rank_t::is_none(&r_local);
  if (bVar1) {
    uVar2 = 0xffffffff;
  }
  else {
    bVar1 = rule_rank_t::is_def(&r_local);
    if (bVar1) {
      uVar2 = 0xfffffffe;
    }
    else {
      uVar2 = rule_rank_t::uint32(&r_local);
    }
  }
  return uVar2;
}

Assistant:

key_t Skeleton::rule2key (rule_rank_t r)
{
	if (r.is_none()) {
		return std::numeric_limits<key_t>::max();
	} else if (r.is_def()) {
		key_t k = std::numeric_limits<key_t>::max();
		return --k;
	} else {
		return static_cast<key_t>(r.uint32());
	}
}